

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_exhaustive_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::InlineExhaustivePass::ProcessImpl(InlineExhaustivePass *this)

{
  Status SVar1;
  IRContext *this_00;
  anon_class_16_2_a97f2545 local_48;
  undefined1 local_38 [8];
  ProcessFunction pfn;
  Status status;
  InlineExhaustivePass *this_local;
  
  pfn._M_invoker._4_4_ = SuccessWithoutChange;
  local_48.status = (Status *)((long)&pfn._M_invoker + 4);
  local_48.this = this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::InlineExhaustivePass::ProcessImpl()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_38,&local_48);
  this_00 = Pass::context((Pass *)this);
  IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)local_38);
  SVar1 = pfn._M_invoker._4_4_;
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_38);
  return SVar1;
}

Assistant:

Pass::Status InlineExhaustivePass::ProcessImpl() {
  Status status = Status::SuccessWithoutChange;
  // Attempt exhaustive inlining on each entry point function in module
  ProcessFunction pfn = [&status, this](Function* fp) {
    status = CombineStatus(status, InlineExhaustive(fp));
    return false;
  };
  context()->ProcessReachableCallTree(pfn);
  return status;
}